

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::sendPendingMoveAndResizeEvents
          (QWidgetPrivate *this,bool recursive,bool disableUpdates)

{
  byte bVar1;
  bool bVar2;
  QWidget *pQVar3;
  QObject *o;
  qsizetype qVar4;
  QWidget *pQVar5;
  byte bVar6;
  byte in_DL;
  byte in_SIL;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *child;
  int i;
  QWidget *q;
  QResizeEvent e_1;
  QMoveEvent e;
  QRect *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar7;
  QRect *in_stack_ffffffffffffff70;
  int local_84;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 local_68 [8];
  QSize local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *in_stack_ffffffffffffffc0;
  QPoint in_stack_ffffffffffffffc8;
  QPoint local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = in_SIL & 1;
  bVar1 = in_DL & 1;
  pQVar3 = q_func(in_RDI);
  uVar7 = false;
  if ((bVar1 & 1) != 0) {
    uVar7 = QWidget::updatesEnabled((QWidget *)0x36febe);
  }
  bVar1 = uVar7;
  if ((bool)uVar7 != false) {
    QWidget::setAttribute
              ((QWidget *)in_stack_ffffffffffffffc8,
               (WidgetAttribute)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
  }
  bVar2 = QWidget::testAttribute
                    ((QWidget *)CONCAT17(uVar7,in_stack_ffffffffffffff68),
                     (WidgetAttribute)((ulong)in_RDI >> 0x20));
  if (bVar2) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = QRect::topLeft(in_stack_ffffffffffffff58);
    in_stack_ffffffffffffffc8 = QRect::topLeft(in_stack_ffffffffffffff58);
    QMoveEvent::QMoveEvent
              ((QMoveEvent *)&local_28,(QPoint *)&local_30,(QPoint *)&stack0xffffffffffffffc8);
    QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)&local_28);
    QWidget::setAttribute
              ((QWidget *)in_stack_ffffffffffffffc8,
               (WidgetAttribute)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
    QMoveEvent::~QMoveEvent((QMoveEvent *)&local_28);
  }
  bVar2 = QWidget::testAttribute
                    ((QWidget *)CONCAT17(uVar7,in_stack_ffffffffffffff68),
                     (WidgetAttribute)((ulong)in_RDI >> 0x20));
  if (bVar2) {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_ffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = QRect::size(in_stack_ffffffffffffff70);
    QSize::QSize((QSize *)in_RDI);
    QResizeEvent::QResizeEvent((QResizeEvent *)&local_58,(QSize *)&local_60,(QSize *)local_68);
    QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)&local_58);
    QWidget::setAttribute
              ((QWidget *)in_stack_ffffffffffffffc8,
               (WidgetAttribute)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
    QResizeEvent::~QResizeEvent((QResizeEvent *)&local_58);
  }
  if ((bVar1 & 1) != 0) {
    QWidget::setAttribute
              ((QWidget *)in_stack_ffffffffffffffc8,
               (WidgetAttribute)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
  }
  if ((bVar6 & 1) != 0) {
    local_84 = 0;
    while( true ) {
      o = (QObject *)(long)local_84;
      qVar4 = QList<QObject_*>::size((QList<QObject_*> *)&in_RDI->field_0x18);
      if (qVar4 <= (long)o) break;
      QList<QObject_*>::at((QList<QObject_*> *)in_RDI,(qsizetype)o);
      pQVar5 = qobject_cast<QWidget*>(o);
      if (pQVar5 != (QWidget *)0x0) {
        QWidget::d_func((QWidget *)0x3700e1);
        sendPendingMoveAndResizeEvents
                  ((QWidgetPrivate *)CONCAT17(bVar6,CONCAT16(bVar1,in_stack_ffffffffffffff88)),
                   SUB81((ulong)pQVar3 >> 0x38,0),SUB81((ulong)pQVar3 >> 0x30,0));
      }
      local_84 = local_84 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::sendPendingMoveAndResizeEvents(bool recursive, bool disableUpdates)
{
    Q_Q(QWidget);

    disableUpdates = disableUpdates && q->updatesEnabled();
    if (disableUpdates)
        q->setAttribute(Qt::WA_UpdatesDisabled);

    if (q->testAttribute(Qt::WA_PendingMoveEvent)) {
        QMoveEvent e(data.crect.topLeft(), data.crect.topLeft());
        QCoreApplication::sendEvent(q, &e);
        q->setAttribute(Qt::WA_PendingMoveEvent, false);
    }

    if (q->testAttribute(Qt::WA_PendingResizeEvent)) {
        QResizeEvent e(data.crect.size(), QSize());
        QCoreApplication::sendEvent(q, &e);
        q->setAttribute(Qt::WA_PendingResizeEvent, false);
    }

    if (disableUpdates)
        q->setAttribute(Qt::WA_UpdatesDisabled, false);

    if (!recursive)
        return;

    for (int i = 0; i < children.size(); ++i) {
        if (QWidget *child = qobject_cast<QWidget *>(children.at(i)))
            child->d_func()->sendPendingMoveAndResizeEvents(recursive, disableUpdates);
    }
}